

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialAlgebraOperators.h
# Opt level: O0

SpatialTransform * __thiscall
RigidBodyDynamics::Math::SpatialTransform::operator=
          (SpatialTransform *this,SpatialTransform *param_2)

{
  Matrix3_t *in_RSI;
  SpatialTransform *in_RDI;
  
  Matrix3_t::operator=(in_RSI,&in_RDI->E);
  Vector3_t::operator=((Vector3_t *)in_RSI,(Vector3_t *)in_RDI);
  return in_RDI;
}

Assistant:

struct RBDL_DLLAPI SpatialTransform {
  SpatialTransform() :
    E (Matrix3d::Identity()),
    r (Vector3d::Zero())
  {}
  SpatialTransform (const Matrix3d &rotation, const Vector3d &translation) :
    E (rotation),
    r (translation)
  {}

  /** Same as X * v.
   *
   * \returns (E * w, - E * rxw + E * v)
   */
  SpatialVector apply (const SpatialVector &v_sp) {
    Vector3d v_rxw (
        v_sp[3] - r[1]*v_sp[2] + r[2]*v_sp[1],
        v_sp[4] - r[2]*v_sp[0] + r[0]*v_sp[2],
        v_sp[5] - r[0]*v_sp[1] + r[1]*v_sp[0]
        );
    return SpatialVector (
        E(0,0) * v_sp[0] + E(0,1) * v_sp[1] + E(0,2) * v_sp[2],
        E(1,0) * v_sp[0] + E(1,1) * v_sp[1] + E(1,2) * v_sp[2],
        E(2,0) * v_sp[0] + E(2,1) * v_sp[1] + E(2,2) * v_sp[2],
        E(0,0) * v_rxw[0] + E(0,1) * v_rxw[1] + E(0,2) * v_rxw[2],
        E(1,0) * v_rxw[0] + E(1,1) * v_rxw[1] + E(1,2) * v_rxw[2],
        E(2,0) * v_rxw[0] + E(2,1) * v_rxw[1] + E(2,2) * v_rxw[2]
        );
  }

  /** Same as X^T * f.
   *
   * \returns (E^T * n + rx * E^T * f, E^T * f)
   */
  SpatialVector applyTranspose (const SpatialVector &f_sp) {
    Vector3d E_T_f (
        E(0,0) * f_sp[3] + E(1,0) * f_sp[4] + E(2,0) * f_sp[5],
        E(0,1) * f_sp[3] + E(1,1) * f_sp[4] + E(2,1) * f_sp[5],
        E(0,2) * f_sp[3] + E(1,2) * f_sp[4] + E(2,2) * f_sp[5]
        );

    return SpatialVector (
        E(0,0) * f_sp[0] + E(1,0) * f_sp[1] + E(2,0) * f_sp[2] - r[2] * E_T_f[1] + r[1] * E_T_f[2],
        E(0,1) * f_sp[0] + E(1,1) * f_sp[1] + E(2,1) * f_sp[2] + r[2] * E_T_f[0] - r[0] * E_T_f[2],
        E(0,2) * f_sp[0] + E(1,2) * f_sp[1] + E(2,2) * f_sp[2] - r[1] * E_T_f[0] + r[0] * E_T_f[1],
        E_T_f [0],
        E_T_f [1],
        E_T_f [2]
        );
  }

  /** Same as X^* I X^{-1}
  */
  SpatialRigidBodyInertia apply (const SpatialRigidBodyInertia &rbi) {
    return SpatialRigidBodyInertia (
        rbi.m,
        E * (rbi.h - rbi.m * r),
        E * 
        ( 
         Matrix3d (
           rbi.Ixx, rbi.Iyx, rbi.Izx,
           rbi.Iyx, rbi.Iyy, rbi.Izy,
           rbi.Izx, rbi.Izy, rbi.Izz
           ) 
         + VectorCrossMatrix (r) * VectorCrossMatrix (rbi.h)
         + (VectorCrossMatrix(rbi.h - rbi.m * r) * VectorCrossMatrix (r))
        )
        * E.transpose()
        );
  }

  /** Same as X^T I X
  */
  SpatialRigidBodyInertia applyTranspose (const SpatialRigidBodyInertia &rbi) {
    Vector3d E_T_mr = E.transpose() * rbi.h + rbi.m * r;
    return SpatialRigidBodyInertia (
        rbi.m,
        E_T_mr,
        E.transpose() * 
        Matrix3d (
          rbi.Ixx, rbi.Iyx, rbi.Izx,
          rbi.Iyx, rbi.Iyy, rbi.Izy,
          rbi.Izx, rbi.Izy, rbi.Izz
          ) * E
        - VectorCrossMatrix(r) * VectorCrossMatrix (E.transpose() * rbi.h)  
        - VectorCrossMatrix (E_T_mr) * VectorCrossMatrix (r));
  }

  SpatialVector applyAdjoint (const SpatialVector &f_sp) {
    Vector3d En_rxf = E * (Vector3d (f_sp[0], f_sp[1], f_sp[2]) - r.cross(Vector3d (f_sp[3], f_sp[4], f_sp[5])));
    //		Vector3d En_rxf = E * (Vector3d (f_sp[0], f_sp[1], f_sp[2]) - r.cross(Eigen::Map<Vector3d> (&(f_sp[3]))));

    return SpatialVector (
        En_rxf[0],
        En_rxf[1],
        En_rxf[2],
        E(0,0) * f_sp[3] + E(0,1) * f_sp[4] + E(0,2) * f_sp[5],
        E(1,0) * f_sp[3] + E(1,1) * f_sp[4] + E(1,2) * f_sp[5],
        E(2,0) * f_sp[3] + E(2,1) * f_sp[4] + E(2,2) * f_sp[5]
        );
  }

  SpatialMatrix toMatrix () const {
    Matrix3d _Erx =
      E * Matrix3d (
          0., -r[2], r[1],
          r[2], 0., -r[0],
          -r[1], r[0], 0.
          );
    SpatialMatrix result;
    result.block<3,3>(0,0) = E;
    result.block<3,3>(0,3) = Matrix3d::Zero();
    result.block<3,3>(3,0) = -_Erx;
    result.block<3,3>(3,3) = E;

    return result;
  }

  SpatialMatrix toMatrixAdjoint () const {
    Matrix3d _Erx =
      E * Matrix3d (
          0., -r[2], r[1],
          r[2], 0., -r[0],
          -r[1], r[0], 0.
          );
    SpatialMatrix result;
    result.block<3,3>(0,0) = E;
    result.block<3,3>(0,3) = -_Erx;
    result.block<3,3>(3,0) = Matrix3d::Zero();
    result.block<3,3>(3,3) = E;

    return result;
  }

  SpatialMatrix toMatrixTranspose () const {
    Matrix3d _Erx =
      E * Matrix3d (
          0., -r[2], r[1],
          r[2], 0., -r[0],
          -r[1], r[0], 0.
          );
    SpatialMatrix result;
    result.block<3,3>(0,0) = E.transpose();
    result.block<3,3>(0,3) = -_Erx.transpose();
    result.block<3,3>(3,0) = Matrix3d::Zero();
    result.block<3,3>(3,3) = E.transpose();

    return result;
  }

  SpatialTransform inverse() const {
    return SpatialTransform (
        E.transpose(),
        - E * r
        );
  }

  SpatialTransform operator* (const SpatialTransform &XT) const {
    return SpatialTransform (E * XT.E, XT.r + XT.E.transpose() * r);
  }

  void operator*= (const SpatialTransform &XT) {
    r = XT.r + XT.E.transpose() * r;
    E *= XT.E;
  }

  Matrix3d E;
  Vector3d r;
}